

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3ExprCodeGeneratedColumn(Parse *pParse,Table *pTab,Column *pCol,int regOut)

{
  ushort uVar1;
  Vdbe *p;
  ExprList *pEVar2;
  int iVar3;
  int addr;
  Op *pOVar4;
  Expr *pExpr;
  
  p = pParse->pVdbe;
  if (pParse->iSelfTab < 1) {
    iVar3 = 0;
  }
  else {
    iVar3 = sqlite3VdbeAddOp3(p,0x14,pParse->iSelfTab + -1,0,regOut);
  }
  uVar1 = pCol->iDflt;
  if ((((uVar1 == 0) || (pTab->eTabType != '\0')) ||
      (pEVar2 = (pTab->u).tab.pDfltList, pEVar2 == (ExprList *)0x0)) ||
     (pEVar2->nExpr < (int)(uint)uVar1)) {
    pExpr = (Expr *)0x0;
  }
  else {
    pExpr = pEVar2->a[uVar1 - 1].pExpr;
  }
  sqlite3ExprCodeCopy(pParse,pExpr,regOut);
  if ('A' < pCol->affinity) {
    addr = sqlite3VdbeAddOp3(p,0x60,regOut,1,0);
    sqlite3VdbeChangeP4(p,addr,&pCol->affinity,1);
  }
  if (iVar3 != 0) {
    if (p->db->mallocFailed == '\0') {
      pOVar4 = p->aOp + iVar3;
    }
    else {
      pOVar4 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar4->p2 = p->nOp;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprCodeGeneratedColumn(
  Parse *pParse,     /* Parsing context */
  Table *pTab,       /* Table containing the generated column */
  Column *pCol,      /* The generated column */
  int regOut         /* Put the result in this register */
){
  int iAddr;
  Vdbe *v = pParse->pVdbe;
  assert( v!=0 );
  assert( pParse->iSelfTab!=0 );
  if( pParse->iSelfTab>0 ){
    iAddr = sqlite3VdbeAddOp3(v, OP_IfNullRow, pParse->iSelfTab-1, 0, regOut);
  }else{
    iAddr = 0;
  }
  sqlite3ExprCodeCopy(pParse, sqlite3ColumnExpr(pTab,pCol), regOut);
  if( pCol->affinity>=SQLITE_AFF_TEXT ){
    sqlite3VdbeAddOp4(v, OP_Affinity, regOut, 1, 0, &pCol->affinity, 1);
  }
  if( iAddr ) sqlite3VdbeJumpHere(v, iAddr);
}